

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O3

_Bool new_player_spot(chunk_conflict *c,player *p)

{
  loc lVar1;
  loc grid_00;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  loc_conflict top_left;
  loc_conflict bottom_right;
  int *state;
  int iVar5;
  bool bVar6;
  bool bVar7;
  loc_conflict grid;
  loc local_40;
  player *local_38;
  
  if ((((p->opts).opt[0x2a] == true) &&
      (lVar1.x = (p->grid).x, lVar1.y = (p->grid).y, _Var2 = square_in_bounds_fully(c,lVar1), _Var2)
      ) && (grid_00.x = (p->grid).x, grid_00.y = (p->grid).y, _Var2 = square_isstairs(c,grid_00),
           _Var2)) {
    local_40.x = (p->grid).x;
    local_40.y = (p->grid).y;
    goto LAB_00159481;
  }
  top_left = loc(1,1);
  bottom_right = loc(c->width + -2,c->height + -2);
  state = cave_find_init(top_left,bottom_right);
  do {
    _Var2 = cave_find_get_grid((loc_conflict *)&local_40,state);
    if (!_Var2) {
      state[4] = 0;
      goto LAB_00159459;
    }
    _Var2 = square_suits_stairs_well(c,local_40);
  } while (!_Var2);
  goto LAB_00159479;
  while (_Var2 = square_suits_stairs_ok(c,local_40), !_Var2) {
LAB_00159459:
    _Var2 = cave_find_get_grid((loc_conflict *)&local_40,state);
    if (!_Var2) {
      iVar5 = 6;
      bVar7 = false;
      local_38 = p;
      do {
        state[4] = 0;
        while( true ) {
          if (bVar7) goto LAB_00159551;
          _Var2 = cave_find_get_grid((loc_conflict *)&local_40,state);
          lVar1 = local_40;
          if (!_Var2) break;
          _Var2 = square_isempty(c,local_40);
          if (((_Var2) && (_Var2 = square_isvault(c,lVar1), !_Var2)) &&
             (_Var2 = square_isno_stairs(c,lVar1), !_Var2)) {
            wVar3 = square_num_walls_adjacent(c,lVar1);
            wVar4 = square_num_walls_diagonal(c,lVar1);
            bVar7 = wVar4 + wVar3 == iVar5;
          }
        }
        bVar6 = iVar5 != 0;
        iVar5 = iVar5 + -1;
      } while ((!bVar7) && (bVar6));
LAB_00159551:
      mem_free(state);
      p = local_38;
      if (!bVar7) {
        msg("Failed to place player; please report.  Restarting generation.");
        dump_level_simple((char *)0x0,"Player Placement Failure",c);
        return false;
      }
      goto LAB_00159481;
    }
  }
LAB_00159479:
  mem_free(state);
LAB_00159481:
  lVar1 = local_40;
  if (((p->opts).opt[0x1e] != false) &&
     ((wVar3 = p->upkeep->create_stair, wVar3 == FEAT_MORE || (wVar3 == FEAT_LESS)))) {
    square_set_feat(c,local_40,wVar3);
  }
  player_place((chunk_conflict2 *)c,p,(loc_conflict)lVar1);
  return true;
}

Assistant:

bool new_player_spot(struct chunk *c, struct player *p)
{
	struct loc grid;

	/* Try to find a good place to put the player */
	if (OPT(p, birth_levels_persist) &&
			square_in_bounds_fully(c, p->grid) &&
			square_isstairs(c, p->grid)) {
		grid = p->grid;
	} else if (!find_start(c, &grid)) {
		msg("Failed to place player; please report.  Restarting generation.");
		dump_level_simple(NULL, "Player Placement Failure", c);
		return false;
	}

	/* Create stairs the player came down if allowed and necessary */
	if (!OPT(p, birth_connect_stairs))
		;
	else if (p->upkeep->create_stair == FEAT_MORE)
		square_set_feat(c, grid, FEAT_MORE);
	else if (p->upkeep->create_stair == FEAT_LESS)
		square_set_feat(c, grid, FEAT_LESS);

	player_place(c, p, grid);
	return true;
}